

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_trng::portable_impl::uint128_&,_const_trng::portable_impl::uint128_&> * __thiscall
Catch::ExprLhs<trng::portable_impl::uint128_const&>::operator>
          (BinaryExpr<const_trng::portable_impl::uint128_&,_const_trng::portable_impl::uint128_&>
           *__return_storage_ptr__,ExprLhs<trng::portable_impl::uint128_const&> *this,uint128 *rhs)

{
  uint128 *puVar1;
  bool bVar2;
  StringRef local_38;
  
  puVar1 = *(uint128 **)this;
  bVar2 = true;
  if (puVar1->m_hi <= rhs->m_hi) {
    bVar2 = rhs->m_lo < puVar1->m_lo && puVar1->m_hi == rhs->m_hi;
  }
  StringRef::StringRef(&local_38,">");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_002eb488;
  __return_storage_ptr__->m_lhs = puVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator > ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs > rhs), m_lhs, ">", rhs };
        }